

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int get_crl_sk(X509_STORE_CTX *ctx,X509_CRL **pcrl,X509 **pissuer,int *pscore,
              stack_st_X509_CRL *crls)

{
  X509_CRL *pXVar1;
  int iVar2;
  X509_CRL *pXVar3;
  ASN1_TIME *from;
  ASN1_TIME *to;
  int local_78;
  int local_74;
  int sec;
  int day;
  X509_CRL *crl;
  size_t i;
  X509 *best_crl_issuer;
  X509 *crl_issuer;
  X509_CRL *best_crl;
  X509 *x;
  int best_score;
  int crl_score;
  stack_st_X509_CRL *crls_local;
  int *pscore_local;
  X509 **pissuer_local;
  X509_CRL **pcrl_local;
  X509_STORE_CTX *ctx_local;
  
  x._0_4_ = *pscore;
  best_crl = (X509_CRL *)ctx->current_cert;
  crl_issuer = (X509 *)0x0;
  best_crl_issuer = (X509 *)0x0;
  i = 0;
  crl = (X509_CRL *)0x0;
  _best_score = crls;
  crls_local = (stack_st_X509_CRL *)pscore;
  pscore_local = (int *)pissuer;
  pissuer_local = (X509 **)pcrl;
  pcrl_local = (X509_CRL **)ctx;
  do {
    pXVar1 = crl;
    pXVar3 = (X509_CRL *)sk_X509_CRL_num(_best_score);
    if (pXVar3 <= pXVar1) {
      if (crl_issuer != (X509 *)0x0) {
        if (*pissuer_local != (X509 *)0x0) {
          X509_CRL_free((X509_CRL *)*pissuer_local);
        }
        *pissuer_local = crl_issuer;
        *(size_t *)pscore_local = i;
        *(int *)crls_local = (int)x;
        X509_CRL_up_ref((X509_CRL *)crl_issuer);
      }
      ctx_local._4_4_ = (uint)(0x1bf < (int)x);
      return ctx_local._4_4_;
    }
    _sec = (X509 *)sk_X509_CRL_value(_best_score,(size_t)crl);
    x._4_4_ = get_crl_score((X509_STORE_CTX *)pcrl_local,&best_crl_issuer,(X509_CRL *)_sec,
                            (X509 *)best_crl);
    if (((int)x <= x._4_4_) && (x._4_4_ != 0)) {
      if ((x._4_4_ == (int)x) && (crl_issuer != (X509 *)0x0)) {
        from = X509_CRL_get0_lastUpdate((X509_CRL *)crl_issuer);
        to = X509_CRL_get0_lastUpdate((X509_CRL *)_sec);
        iVar2 = ASN1_TIME_diff(&local_74,&local_78,from,to);
        if ((iVar2 == 0) || ((local_74 < 1 && (local_78 < 1)))) goto LAB_00253d04;
      }
      crl_issuer = _sec;
      i = (size_t)best_crl_issuer;
      x._0_4_ = x._4_4_;
    }
LAB_00253d04:
    crl = (X509_CRL *)((long)&crl->crl + 1);
  } while( true );
}

Assistant:

static int get_crl_sk(X509_STORE_CTX *ctx, X509_CRL **pcrl, X509 **pissuer,
                      int *pscore, STACK_OF(X509_CRL) *crls) {
  int crl_score, best_score = *pscore;
  X509 *x = ctx->current_cert;
  X509_CRL *best_crl = NULL;
  X509 *crl_issuer = NULL, *best_crl_issuer = NULL;

  for (size_t i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    crl_score = get_crl_score(ctx, &crl_issuer, crl, x);
    if (crl_score < best_score || crl_score == 0) {
      continue;
    }
    // If current CRL is equivalent use it if it is newer
    if (crl_score == best_score && best_crl != NULL) {
      int day, sec;
      if (ASN1_TIME_diff(&day, &sec, X509_CRL_get0_lastUpdate(best_crl),
                         X509_CRL_get0_lastUpdate(crl)) == 0) {
        continue;
      }
      // ASN1_TIME_diff never returns inconsistent signs for |day|
      // and |sec|.
      if (day <= 0 && sec <= 0) {
        continue;
      }
    }
    best_crl = crl;
    best_crl_issuer = crl_issuer;
    best_score = crl_score;
  }

  if (best_crl) {
    if (*pcrl) {
      X509_CRL_free(*pcrl);
    }
    *pcrl = best_crl;
    *pissuer = best_crl_issuer;
    *pscore = best_score;
    X509_CRL_up_ref(best_crl);
  }

  if (best_score >= CRL_SCORE_VALID) {
    return 1;
  }

  return 0;
}